

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_image_format_type_t type)

{
  char *pcVar1;
  string local_30;
  
  switch(type) {
  case ZE_IMAGE_FORMAT_TYPE_UINT:
    pcVar1 = "ZE_IMAGE_FORMAT_TYPE_UINT";
    break;
  case ZE_IMAGE_FORMAT_TYPE_SINT:
    pcVar1 = "ZE_IMAGE_FORMAT_TYPE_SINT";
    break;
  case ZE_IMAGE_FORMAT_TYPE_UNORM:
    pcVar1 = "ZE_IMAGE_FORMAT_TYPE_UNORM";
    break;
  case ZE_IMAGE_FORMAT_TYPE_SNORM:
    pcVar1 = "ZE_IMAGE_FORMAT_TYPE_SNORM";
    break;
  case ZE_IMAGE_FORMAT_TYPE_FLOAT:
    pcVar1 = "ZE_IMAGE_FORMAT_TYPE_FLOAT";
    break;
  default:
    std::__cxx11::to_string(&local_30,type);
    std::operator+(__return_storage_ptr__,"Unknown ze_image_format_type_t value: ",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_image_format_type_t type) {
  if (type == ZE_IMAGE_FORMAT_TYPE_UINT) {
    return "ZE_IMAGE_FORMAT_TYPE_UINT";
  } else if (type == ZE_IMAGE_FORMAT_TYPE_SINT) {
    return "ZE_IMAGE_FORMAT_TYPE_SINT";
  } else if (type == ZE_IMAGE_FORMAT_TYPE_UNORM) {
    return "ZE_IMAGE_FORMAT_TYPE_UNORM";
  } else if (type == ZE_IMAGE_FORMAT_TYPE_SNORM) {
    return "ZE_IMAGE_FORMAT_TYPE_SNORM";
  } else if (type == ZE_IMAGE_FORMAT_TYPE_FLOAT) {
    return "ZE_IMAGE_FORMAT_TYPE_FLOAT";
  } else {
    return "Unknown ze_image_format_type_t value: " +
           std::to_string(static_cast<int>(type));
  }
}